

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O0

void __thiscall S2LatLngRectBounder::AddPoint(S2LatLngRectBounder *this,S2Point *b)

{
  S2Point *b_00;
  bool bVar1;
  ostream *poVar2;
  S2LatLng local_58 [2];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Point *local_18;
  S2Point *b_local;
  S2LatLngRectBounder *this_local;
  
  local_18 = b;
  b_local = &this->a_;
  bVar1 = S2::IsUnitLength(b);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect_bounder.cc"
               ,0x22,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(b) ");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  b_00 = local_18;
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  S2LatLng::S2LatLng(local_58,local_18);
  AddInternal(this,b_00,local_58);
  return;
}

Assistant:

void S2LatLngRectBounder::AddPoint(const S2Point& b) {
  S2_DCHECK(S2::IsUnitLength(b));
  AddInternal(b, S2LatLng(b));
}